

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZVec<int> *blocksizes,
          TPZFMatrix<std::complex<float>_> *glob)

{
  long lVar1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  int *piVar4;
  long *plVar5;
  uint uVar6;
  long *in_RDX;
  TPZVec<int> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<std::complex<float>_> *this_00;
  TPZRegisterClassId *newsize;
  int64_t c;
  int64_t r;
  int64_t eq;
  int64_t pos;
  int bsize;
  int64_t neq;
  int64_t ndata;
  int64_t b;
  int64_t nblock;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  long *in_stack_ffffffffffffff00;
  int64_t in_stack_ffffffffffffff08;
  TPZVec<long> *in_stack_ffffffffffffff10;
  long local_90;
  long local_88;
  long local_80;
  complex<float> local_6c;
  int local_64;
  long local_60;
  long local_58;
  long local_50;
  undefined8 local_48;
  complex<float> *local_40;
  undefined8 local_28;
  undefined8 local_20;
  long *local_18;
  TPZVec<int> *local_10;
  
  local_20 = 0;
  local_28 = 0x21;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<std::complex<float>>>(in_RDI,0x21);
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (void **)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  *(undefined ***)in_RDI = &PTR__TPZBlockDiagonal_023f12b8;
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x20));
  this_00 = (TPZVec<std::complex<float>_> *)(in_RDI + 0x40);
  TPZVec<long>::TPZVec((TPZVec<long> *)this_00);
  newsize = in_RDI + 0x60;
  TPZVec<int>::TPZVec((TPZVec<int> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (TPZVec<int> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pcVar3 = (complex<float> *)TPZVec<int>::NElements(local_10);
  local_48 = 0;
  local_40 = pcVar3;
  TPZVec<long>::Resize
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_58 = 0;
  local_60 = 0;
  for (local_50 = 0; local_50 < (long)local_40; local_50 = local_50 + 1) {
    piVar4 = TPZVec<int>::operator[](local_10,local_50);
    local_64 = *piVar4;
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50);
    lVar1 = *plVar5;
    uVar6 = local_64 * local_64;
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50 + 1);
    *plVar5 = lVar1 + (ulong)uVar6;
    local_58 = local_64 * local_64 + local_58;
    local_60 = local_64 + local_60;
  }
  std::complex<float>::complex(&local_6c,0.0,0.0);
  TPZVec<std::complex<float>_>::Resize(this_00,(int64_t)newsize,pcVar3);
  *(long *)(in_RDI + 8) = local_60;
  *(long *)(in_RDI + 0x10) = local_60;
  local_80 = 0;
  for (local_50 = 0; local_50 < (long)local_40; local_50 = local_50 + 1) {
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_50);
    local_64 = *piVar4;
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50);
    lVar1 = *plVar5;
    for (local_88 = 0; local_88 < local_64; local_88 = local_88 + 1) {
      for (local_90 = 0; local_90 < local_64; local_90 = local_90 + 1) {
        _Var2 = (**(code **)(*local_18 + 0x120))(local_18,local_80 + local_88,local_80 + local_90);
        pcVar3 = TPZVec<std::complex<float>_>::operator[]
                           ((TPZVec<std::complex<float>_> *)(in_RDI + 0x20),
                            lVar1 + local_88 + local_64 * local_90);
        pcVar3->_M_value = _Var2;
      }
    }
    local_80 = local_64 + local_80;
  }
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksizes, const TPZFMatrix<TVar> &glob)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fBlockSize(blocksizes)
{
	int64_t nblock = blocksizes.NElements();
	fBlockPos.Resize(nblock+1,0);
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksizes[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
	fStorage.Resize(ndata,0.);
	this->fRow = neq;
	this->fCol = neq;
	int64_t pos;
	int64_t eq = 0, r, c;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		pos = fBlockPos[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				fStorage[pos+r+bsize*c]= glob.GetVal(eq+r,eq+c);
			}
		}
		eq += bsize;
	}
	
}